

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SubD *subd,ON_SimpleArray<ON_COMPONENT_INDEX> *unsorted_edges,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges)

{
  uint edge_id;
  uint uVar1;
  uint i;
  ulong uVar2;
  ON_SubDEdge *e;
  ON_SimpleArray<const_ON_SubDEdge_*> local_unsorted_edges;
  ON_SubDEdge *local_50;
  ON_SimpleArray<const_ON_SubDEdge_*> local_48;
  
  uVar1 = unsorted_edges->m_count;
  ON_SimpleArray<const_ON_SubDEdge_*>::ON_SimpleArray(&local_48,(ulong)uVar1);
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    if ((unsorted_edges->m_a[uVar2].m_type == subd_edge) &&
       (edge_id = unsorted_edges->m_a[uVar2].m_index, 1 < edge_id + 1)) {
      local_50 = ON_SubD::EdgeFromId(subd,edge_id);
      if (local_50 != (ON_SubDEdge *)0x0) {
        ON_SimpleArray<const_ON_SubDEdge_*>::Append(&local_48,&local_50);
      }
    }
  }
  uVar1 = Internal_MuchImprovedSortEdgesIntoChains
                    ((ON__UINT_PTR *)local_48.m_a,(ulong)(uint)unsorted_edges->m_count,sorted_edges)
  ;
  ON_SimpleArray<const_ON_SubDEdge_*>::~ON_SimpleArray(&local_48);
  return uVar1;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SubD& subd,
  const ON_SimpleArray< ON_COMPONENT_INDEX >& unsorted_edges,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges
)
{
  const unsigned unsorted_count = unsorted_edges.UnsignedCount();
  ON_SimpleArray< const ON_SubDEdge* > local_unsorted_edges(unsorted_count);
  for (unsigned i = 0; i < unsorted_count; ++i)
  {
    const ON_COMPONENT_INDEX ci = unsorted_edges[i];
    if (ON_COMPONENT_INDEX::TYPE::subd_edge != ci.m_type)
      continue;
    if (0 == ci.m_index || -1 == ci.m_index)
      continue;
    const ON_SubDEdge* e = subd.EdgeFromId((unsigned)ci.m_index);
    if (nullptr == e)
      continue;
    local_unsorted_edges.Append(e);
  }

  return Internal_MuchImprovedSortEdgesIntoChains(
    (const ON__UINT_PTR*)local_unsorted_edges.Array(),
    unsorted_edges.UnsignedCount(),
    sorted_edges
  );
}